

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O0

void tchecker::log_output_count(ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  
  if (_log_error_count != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(os,_log_error_count);
    std::operator<<(poVar1," error(s)");
  }
  if ((_log_error_count != 0) && (_log_warning_count != 0)) {
    std::operator<<(os," and ");
  }
  if (_log_warning_count != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(os,_log_warning_count);
    std::operator<<(poVar1," warning(s)");
  }
  if ((_log_error_count != 0) || (_log_warning_count != 0)) {
    std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void log_output_count(std::ostream & os)
{
  if (tchecker::_log_error_count > 0)
    os << tchecker::_log_error_count << " error(s)";
  if (tchecker::_log_error_count > 0 && tchecker::_log_warning_count > 0)
    os << " and ";
  if (tchecker::_log_warning_count > 0)
    os << tchecker::_log_warning_count << " warning(s)";
  if (tchecker::_log_error_count > 0 || tchecker::_log_warning_count > 0)
    os << std::endl;
}